

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcole.c
# Opt level: O0

int fffi8r4(LONGLONG *input,long ntodo,double scale,double zero,int nullcheck,LONGLONG tnull,
           float nullval,char *nullarray,int *anynull,float *output,int *status)

{
  float local_6c;
  float local_64;
  ULONGLONG ulltemp;
  long ii;
  int *anynull_local;
  char *nullarray_local;
  float nullval_local;
  LONGLONG tnull_local;
  int nullcheck_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  LONGLONG *input_local;
  
  if (nullcheck == 0) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 9.223372036854776e+18 || (NAN(zero))))) {
      if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
        for (ulltemp = 0; (long)ulltemp < ntodo; ulltemp = ulltemp + 1) {
          output[ulltemp] = (float)((double)input[ulltemp] * scale + zero);
        }
      }
      else {
        for (ulltemp = 0; (long)ulltemp < ntodo; ulltemp = ulltemp + 1) {
          output[ulltemp] = (float)input[ulltemp];
        }
      }
    }
    else {
      for (ulltemp = 0; (long)ulltemp < ntodo; ulltemp = ulltemp + 1) {
        local_64 = (float)(input[ulltemp] ^ 0x8000000000000000);
        output[ulltemp] = local_64;
      }
    }
  }
  else if ((((scale != 1.0) || (NAN(scale))) || (zero != 9.223372036854776e+18)) || (NAN(zero))) {
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (ulltemp = 0; (long)ulltemp < ntodo; ulltemp = ulltemp + 1) {
        if (input[ulltemp] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ulltemp] = nullval;
          }
          else {
            nullarray[ulltemp] = '\x01';
          }
        }
        else {
          output[ulltemp] = (float)((double)input[ulltemp] * scale + zero);
        }
      }
    }
    else {
      for (ulltemp = 0; (long)ulltemp < ntodo; ulltemp = ulltemp + 1) {
        if (input[ulltemp] == tnull) {
          *anynull = 1;
          if (nullcheck == 1) {
            output[ulltemp] = nullval;
          }
          else {
            nullarray[ulltemp] = '\x01';
          }
        }
        else {
          output[ulltemp] = (float)input[ulltemp];
        }
      }
    }
  }
  else {
    for (ulltemp = 0; (long)ulltemp < ntodo; ulltemp = ulltemp + 1) {
      if (input[ulltemp] == tnull) {
        *anynull = 1;
        if (nullcheck == 1) {
          output[ulltemp] = nullval;
        }
        else {
          nullarray[ulltemp] = '\x01';
        }
      }
      else {
        local_6c = (float)(input[ulltemp] ^ 0x8000000000000000);
        output[ulltemp] = local_6c;
      }
    }
  }
  return *status;
}

Assistant:

int fffi8r4(LONGLONG *input,      /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            LONGLONG tnull,       /* I - value of FITS TNULLn keyword if any */
            float nullval,        /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
            float *output,        /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to tnull.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    ULONGLONG ulltemp;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of adding 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);
                output[ii] = (float) ulltemp;
            }
        }
        else if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                output[ii] = (float) input[ii];  /* copy input to output */
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                output[ii] = (float) (input[ii] * scale + zero);
            }
        }
    }
    else        /* must check for null values */
    {
        if (scale == 1. && zero ==  9223372036854775808.)
        {       
            /* The column we read contains unsigned long long values. */
            /* Instead of subtracting 9223372036854775808, it is more efficient */
            /* and more precise to just flip the sign bit with the XOR operator */

            for (ii = 0; ii < ntodo; ii++) {
 
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
		{
                    ulltemp = (ULONGLONG) (((LONGLONG) input[ii]) ^ 0x8000000000000000);
                    output[ii] = (float) ulltemp;
                }
            }
        }
        else if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                    output[ii] = (float) input[ii];
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] == tnull)
                {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                }
                else
                {
                    output[ii] = (float) (input[ii] * scale + zero);
                }
            }
        }
    }
    return(*status);
}